

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O2

const_iterator __thiscall QUrlQueryPrivate::findKey(QUrlQueryPrivate *this,QString *key)

{
  pair<QString,_QString> *ppVar1;
  int iVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  ppVar1 = (this->itemList).d.ptr;
  recodeFromUser((QString *)&local_40,this,key);
  iVar2 = findRecodedKey(this,(QString *)&local_40,0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (const_iterator)(ppVar1 + iVar2);
  }
  __stack_chk_fail();
}

Assistant:

Map::const_iterator findKey(const QString &key) const
    { return itemList.constBegin() + findRecodedKey(recodeFromUser(key)); }